

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meiju_1.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  istream *this;
  ostream *poVar2;
  int iVar3;
  int x;
  int m;
  int n;
  int local_20;
  int local_1c;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_1c);
  std::istream::operator>>(this,&local_20);
  iVar3 = 0;
  for (x = local_1c; x <= local_20; x = x + 1) {
    bVar1 = judge(x);
    iVar3 = iVar3 + (uint)!bVar1;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main()
{
    int n,m,cnt = 0;
    cin >> n >> m;
    for (int i = n; i <= m; ++i) {
        if(!judge(i))
        {
            cnt++;
        }
    }
    cout << cnt << endl;
    return 0;
}